

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O3

VectorXd __thiscall ChebTools::ChebyshevExpansion::get_nodes_realworld(ChebyshevExpansion *this)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  double *pdVar5;
  DenseStorage<double,__1,__1,_1,_0> *other;
  Index index;
  ulong uVar6;
  ulong uVar7;
  Index extraout_RDX;
  long in_RSI;
  Index othersize;
  VectorXd VVar8;
  DenseStorage<double,__1,__1,_1,_0> local_48;
  double local_38;
  undefined8 uStack_30;
  double local_28;
  undefined8 uStack_20;
  
  local_28 = *(double *)(in_RSI + 0x18) - *(double *)(in_RSI + 0x10);
  uStack_20 = 0;
  other = (DenseStorage<double,__1,__1,_1,_0> *)
          ChebyshevLobattoNodesLibrary::get
                    ((ChebyshevLobattoNodesLibrary *)CLnodes_library,*(long *)(in_RSI + 8) - 1);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_48,other);
  if (local_48.m_rows < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/CwiseNullaryOp.h"
                  ,0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Array<double, -1, 1>]"
                 );
  }
  local_38 = *(double *)(in_RSI + 0x18) + *(double *)(in_RSI + 0x10);
  uStack_30 = 0;
  (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
            ((DenseStorage<double,__1,__1,_1,_0> *)this,local_48.m_rows,local_48.m_rows,1);
  pdVar5 = local_48.m_data;
  if (((this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
       != local_48.m_rows) &&
     (Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
                ((DenseStorage<double,__1,__1,_1,_0> *)this,local_48.m_rows,local_48.m_rows,1),
     (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
     local_48.m_rows)) {
    __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/AssignEvaluator.h"
                  ,0x2fd,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, 1>>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, 1>>>, T1 = double, T2 = double]"
                 );
  }
  pdVar3 = (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  uVar6 = local_48.m_rows & 0x7ffffffffffffffe;
  if (1 < (ulong)local_48.m_rows) {
    uVar7 = 0;
    do {
      pdVar1 = pdVar5 + uVar7;
      dVar4 = pdVar1[1];
      pdVar2 = pdVar3 + uVar7;
      *pdVar2 = (*pdVar1 * local_28 + local_38) * 0.5;
      pdVar2[1] = (dVar4 * local_28 + local_38) * 0.5;
      uVar7 = uVar7 + 2;
    } while (uVar7 < uVar6);
  }
  if ((long)uVar6 < local_48.m_rows) {
    do {
      pdVar3[uVar6] = (pdVar5[uVar6] * local_28 + local_38) * 0.5;
      uVar6 = uVar6 + 1;
    } while (local_48.m_rows != uVar6);
  }
  free(local_48.m_data);
  VVar8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  VVar8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (VectorXd)VVar8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Eigen::VectorXd ChebyshevExpansion::get_nodes_realworld() {
        return ((m_xmax - m_xmin)*get_nodes_n11().array() + (m_xmax + m_xmin))*0.5;
    }